

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mux.c
# Opt level: O0

int envy_bios_parse_mux(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  envy_bios_mux *peVar6;
  envy_bios_mux_entry *peVar7;
  int local_40;
  byte local_3c [4];
  int j;
  uint8_t sub [4];
  envy_bios_mux_entry *entry;
  int i;
  int wantrlen;
  int wanthlen;
  int err;
  envy_bios_mux *mux;
  envy_bios *bios_local;
  
  peVar6 = &bios->mux;
  if (peVar6->offset == 0) {
    bios_local._4_4_ = 0;
  }
  else {
    iVar1 = bios_u8(bios,(uint)peVar6->offset,&(bios->mux).version);
    iVar2 = bios_u8(bios,peVar6->offset + 1,&(bios->mux).hlen);
    iVar3 = bios_u8(bios,peVar6->offset + 2,&(bios->mux).entriesnum);
    iVar4 = bios_u8(bios,peVar6->offset + 3,&(bios->mux).rlen);
    if (iVar4 == 0 && (iVar3 == 0 && (iVar2 == 0 && iVar1 == 0))) {
      envy_bios_block(bios,(uint)peVar6->offset,
                      (uint)(bios->mux).hlen + (uint)(bios->mux).rlen * (uint)(bios->mux).entriesnum
                      ,"MUX",-1);
      if ((bios->mux).version == '\x10') {
        if ((bios->mux).hlen < 4) {
          fprintf(_stderr,"MUX table header too short [%d < %d]\n",(ulong)(bios->mux).hlen,4);
          bios_local._4_4_ = -0x16;
        }
        else if ((bios->mux).rlen < 5) {
          fprintf(_stderr,"MUX table record too short [%d < %d]\n",(ulong)(bios->mux).rlen,5);
          bios_local._4_4_ = -0x16;
        }
        else {
          if (4 < (bios->mux).hlen) {
            fprintf(_stderr,"MUX table header longer than expected [%d > %d]\n",
                    (ulong)(bios->mux).hlen,4);
          }
          if (5 < (bios->mux).rlen) {
            fprintf(_stderr,"MUX table record longer than expected [%d > %d]\n",
                    (ulong)(bios->mux).rlen,5);
          }
          peVar7 = (envy_bios_mux_entry *)calloc((ulong)(bios->mux).entriesnum,0x14);
          (bios->mux).entries = peVar7;
          if ((bios->mux).entries == (envy_bios_mux_entry *)0x0) {
            bios_local._4_4_ = -0xc;
          }
          else {
            wantrlen = 0;
            for (entry._0_4_ = 0; (int)entry < (int)(uint)(bios->mux).entriesnum;
                entry._0_4_ = (int)entry + 1) {
              _j = (bios->mux).entries + (int)entry;
              _j->offset = peVar6->offset + (ushort)(bios->mux).hlen +
                           (ushort)(bios->mux).rlen * (short)(int)entry;
              uVar5 = bios_u8(bios,(uint)_j->offset,&_j->idx);
              wantrlen = uVar5 | wantrlen;
              for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
                uVar5 = bios_u8(bios,(uint)_j->offset + local_40 + 1,local_3c + local_40);
                wantrlen = uVar5 | wantrlen;
                _j->sub_loc[local_40] = local_3c[local_40] & 1;
                _j->sub_line[local_40] = (byte)((int)(uint)local_3c[local_40] >> 1) & 0x1f;
                _j->sub_val[local_40] = (byte)((int)(uint)local_3c[local_40] >> 6) & 1;
                _j->sub_unk7[local_40] = (uint8_t)((int)(uint)local_3c[local_40] >> 7);
              }
              if (wantrlen != 0) {
                return -0xe;
              }
            }
            (bios->mux).valid = '\x01';
            bios_local._4_4_ = 0;
          }
        }
      }
      else {
        fprintf(_stderr,"Unknown MUX table version %d.%d\n",
                (ulong)(uint)((int)(uint)(bios->mux).version >> 4),
                (ulong)((bios->mux).version & 0xf));
        bios_local._4_4_ = -0x16;
      }
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_mux (struct envy_bios *bios) {
	struct envy_bios_mux *mux = &bios->mux;
	if (!mux->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, mux->offset, &mux->version);
	err |= bios_u8(bios, mux->offset+1, &mux->hlen);
	err |= bios_u8(bios, mux->offset+2, &mux->entriesnum);
	err |= bios_u8(bios, mux->offset+3, &mux->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, mux->offset, mux->hlen + mux->rlen * mux->entriesnum, "MUX", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (mux->version) {
		case 0x10:
			wanthlen = 4;
			wantrlen = 5;
			break;
		default:
			ENVY_BIOS_ERR("Unknown MUX table version %d.%d\n", mux->version >> 4, mux->version & 0xf);
			return -EINVAL;
	}
	if (mux->hlen < wanthlen) {
		ENVY_BIOS_ERR("MUX table header too short [%d < %d]\n", mux->hlen, wanthlen);
		return -EINVAL;
	}
	if (mux->rlen < wantrlen) {
		ENVY_BIOS_ERR("MUX table record too short [%d < %d]\n", mux->rlen, wantrlen);
		return -EINVAL;
	}
	if (mux->hlen > wanthlen) {
		ENVY_BIOS_WARN("MUX table header longer than expected [%d > %d]\n", mux->hlen, wanthlen);
	}
	if (mux->rlen > wantrlen) {
		ENVY_BIOS_WARN("MUX table record longer than expected [%d > %d]\n", mux->rlen, wantrlen);
	}
	mux->entries = calloc(mux->entriesnum, sizeof *mux->entries);
	if (!mux->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < mux->entriesnum; i++) {
		struct envy_bios_mux_entry *entry = &mux->entries[i];
		entry->offset = mux->offset + mux->hlen + mux->rlen * i;
		uint8_t sub[4];
		err |= bios_u8(bios, entry->offset, &entry->idx);
		int j;
		for (j = 0; j < 4; j++) {
			err |= bios_u8(bios, entry->offset+j+1, &sub[j]);
			entry->sub_loc[j] = sub[j] & 1;
			entry->sub_line[j] = sub[j] >> 1 & 0x1f;
			entry->sub_val[j] = sub[j] >> 6 & 1;
			entry->sub_unk7[j] = sub[j] >> 7 & 1;
		}
		if (err)
			return -EFAULT;
	}
	mux->valid = 1;
	return 0;
}